

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O3

optional_idx duckdb::Prefix::GetMismatchWithKey(ART *art,Node *node,ARTKey *key,idx_t *depth)

{
  byte bVar1;
  idx_t iVar2;
  data_ptr_t pdVar3;
  idx_t index;
  Prefix prefix;
  optional_idx local_40;
  Prefix local_38;
  
  Prefix(&local_38,art,(Node)(node->super_IndexPointer).data,false,false);
  bVar1 = art->prefix_count;
  if (local_38.data[bVar1] != '\0') {
    iVar2 = *depth;
    pdVar3 = key->data;
    index = 0;
    do {
      if (local_38.data[index] != pdVar3[index + iVar2]) {
        optional_idx::optional_idx(&local_40,index);
        return (optional_idx)local_40.index;
      }
      *depth = iVar2 + 1 + index;
      index = index + 1;
    } while (index < local_38.data[bVar1]);
  }
  return (optional_idx)0xffffffffffffffff;
}

Assistant:

optional_idx Prefix::GetMismatchWithKey(ART &art, const Node &node, const ARTKey &key, idx_t &depth) {
	Prefix prefix(art, node);
	for (idx_t i = 0; i < prefix.data[Prefix::Count(art)]; i++) {
		if (prefix.data[i] != key[depth]) {
			return i;
		}
		depth++;
	}
	return optional_idx::Invalid();
}